

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  TestNode *pTVar1;
  ulong extraout_RAX;
  ShaderLogCase *this_00;
  ulong uVar2;
  uint local_20;
  int ndx;
  ShaderStateQueryTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::CoreSamplerTypeCase::CoreSamplerTypeCase
            ((CoreSamplerTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,"sampler_type",
             "Sampler type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::MSArraySamplerTypeCase::MSArraySamplerTypeCase
            ((MSArraySamplerTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sampler_type_multisample_array","MSAA array sampler type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::TextureBufferSamplerTypeCase::TextureBufferSamplerTypeCase
            ((TextureBufferSamplerTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sampler_type_texture_buffer","Texture buffer sampler type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::TextureBufferImageTypeCase::TextureBufferImageTypeCase
            ((TextureBufferImageTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "image_type_texture_buffer","Texture buffer image type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::CubeArraySamplerTypeCase::CubeArraySamplerTypeCase
            ((CubeArraySamplerTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "sampler_type_cube_array","Cube array sampler type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x80);
  anon_unknown_1::CubeArrayImageTypeCase::CubeArrayImageTypeCase
            ((CubeArrayImageTypeCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "image_type_cube_array","Cube array image type cases");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  local_20 = 0;
  uVar2 = extraout_RAX;
  while ((int)local_20 < 6) {
    this_00 = (ShaderLogCase *)operator_new(0x80);
    anon_unknown_1::ShaderLogCase::ShaderLogCase
              (this_00,(this->super_TestCaseGroup).m_context,
               init::shaderTypes[(int)local_20].caseName,"",
               init::shaderTypes[(int)local_20].caseType);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    local_20 = local_20 + 1;
    uVar2 = (ulong)local_20;
  }
  return (int)uVar2;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	addChild(new CoreSamplerTypeCase			(m_context, "sampler_type",						"Sampler type cases"));
	addChild(new MSArraySamplerTypeCase			(m_context, "sampler_type_multisample_array",	"MSAA array sampler type cases"));
	addChild(new TextureBufferSamplerTypeCase	(m_context, "sampler_type_texture_buffer",		"Texture buffer sampler type cases"));
	addChild(new TextureBufferImageTypeCase		(m_context, "image_type_texture_buffer",		"Texture buffer image type cases"));
	addChild(new CubeArraySamplerTypeCase		(m_context, "sampler_type_cube_array",			"Cube array sampler type cases"));
	addChild(new CubeArrayImageTypeCase			(m_context, "image_type_cube_array",			"Cube array image type cases"));

	// shader info log tests
	// \note, there exists similar tests in gles3 module. However, the gles31 could use a different
	//        shader compiler with different INFO_LOG bugs.
	{
		static const struct
		{
			const char*		caseName;
			glu::ShaderType	caseType;
		} shaderTypes[] =
		{
			{ "info_log_vertex",		glu::SHADERTYPE_VERTEX					},
			{ "info_log_fragment",		glu::SHADERTYPE_FRAGMENT				},
			{ "info_log_geometry",		glu::SHADERTYPE_GEOMETRY				},
			{ "info_log_tess_ctrl",		glu::SHADERTYPE_TESSELLATION_CONTROL	},
			{ "info_log_tess_eval",		glu::SHADERTYPE_TESSELLATION_EVALUATION	},
			{ "info_log_compute",		glu::SHADERTYPE_COMPUTE					},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
			addChild(new ShaderLogCase(m_context, shaderTypes[ndx].caseName, "", shaderTypes[ndx].caseType));
	}
}